

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

void Gia_ManSimRelCheckFuncs(Gia_Man_t *p,Vec_Wrd_t *vRel,int nOuts,Vec_Wrd_t *vFuncs)

{
  uint *puVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  word *pwVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  sbyte sVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  int i;
  uint uVar17;
  int local_118;
  int Values [32];
  
  bVar3 = (byte)nOuts & 0x1f;
  uVar14 = 1 << bVar3;
  iVar4 = vRel->nSize / (int)uVar14;
  if (vFuncs->nSize != nOuts * iVar4 * 2) {
    __assert_fail("Vec_WrdSize(vFuncs) == 2 * nOuts * nWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x2f4,"void Gia_ManSimRelCheckFuncs(Gia_Man_t *, Vec_Wrd_t *, int, Vec_Wrd_t *)")
    ;
  }
  if (0x20 < nOuts) {
    __assert_fail("nOuts <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x2f5,"void Gia_ManSimRelCheckFuncs(Gia_Man_t *, Vec_Wrd_t *, int, Vec_Wrd_t *)")
    ;
  }
  uVar13 = iVar4 << 6;
  uVar16 = 0;
  if (0 < nOuts) {
    uVar16 = (ulong)(uint)nOuts;
  }
  if (1 << bVar3 < 1) {
    uVar14 = 0;
  }
  if (iVar4 << 6 < 1) {
    uVar13 = 0;
  }
  local_118 = 0;
  uVar17 = 0;
  do {
    if (uVar17 == uVar13) {
      if (local_118 == 0) {
        puts("The function agrees with the relation.");
        return;
      }
      printf("Total number of similar errors = %d.\n");
      return;
    }
    sVar10 = (sbyte)(uVar17 & 0x3f);
    i = 0;
    uVar9 = (ulong)((uVar17 >> 6) << 3);
    for (uVar8 = 0; uVar16 != uVar8; uVar8 = uVar8 + 1) {
      pwVar5 = Vec_WrdEntryP(vFuncs,i);
      uVar2 = *(ulong *)((long)pwVar5 + uVar9);
      uVar6 = uVar2 >> sVar10;
      pwVar5 = Vec_WrdEntryP(vFuncs,iVar4 + i);
      uVar7 = *(ulong *)((long)pwVar5 + uVar9) & 1L << sVar10;
      if (((((uVar2 >> (ulong)(uVar17 & 0x3f) & 1) == 0) || (iVar11 = 1, uVar7 != 0)) &&
          (((uVar6 & 1) != 0 || (iVar11 = 2, uVar7 == 0)))) &&
         (((uVar6 & 1) != 0 || (iVar11 = 3, uVar7 != 0)))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                      ,0x302,
                      "void Gia_ManSimRelCheckFuncs(Gia_Man_t *, Vec_Wrd_t *, int, Vec_Wrd_t *)");
      }
      Values[uVar8] = iVar11;
      i = i + iVar4 * 2;
    }
    uVar8 = 0;
    while (uVar15 = (uint)uVar8, uVar15 != uVar14) {
      uVar9 = 0;
      do {
        if (uVar16 == uVar9) {
          uVar12 = uVar15 + (uVar17 << ((byte)nOuts & 0x1f));
          if ((vRel->pArray[(int)uVar12 >> 6] >> ((ulong)uVar12 & 0x3f) & 1) == 0) {
            if (local_118 == 0) {
              printf("For pattern %d, minterm %d produced by function is not in the relation.\n",
                     (ulong)uVar17,uVar8);
              local_118 = 1;
            }
            else {
              local_118 = local_118 + 1;
            }
          }
          break;
        }
        puVar1 = (uint *)(Values + uVar9);
        uVar12 = (uint)uVar9;
        uVar9 = uVar9 + 1;
      } while ((*puVar1 >> ((uVar15 >> (uVar12 & 0x1f) & 1) != 0) & 1) != 0);
      uVar8 = (ulong)(uVar15 + 1);
    }
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

void Gia_ManSimRelCheckFuncs( Gia_Man_t * p, Vec_Wrd_t * vRel, int nOuts, Vec_Wrd_t * vFuncs )
{
    int i, k, m, Values[32], nErrors = 0, nMints = 1 << nOuts, nWords = Vec_WrdSize(vRel) / nMints;
    assert( Vec_WrdSize(vFuncs) == 2 * nOuts * nWords );
    assert( nOuts <= 32 );
    for ( i = 0; i < 64 * nWords; i++ )
    {
        for ( k = 0; k < nOuts; k++ )
        {
            int Value0 = Abc_TtGetBit( Vec_WrdEntryP(vFuncs, (2*k+0)*nWords), i );
            int Value1 = Abc_TtGetBit( Vec_WrdEntryP(vFuncs, (2*k+1)*nWords), i );
            if ( Value0 && !Value1 )
                Values[k] = 1;
            else if ( !Value0 && Value1 )
                Values[k] = 2;
            else if ( !Value0 && !Value1 )
                Values[k] = 3;
            else assert( 0 );
        }
        for ( m = 0; m < nMints; m++ )
        {
            for ( k = 0; k < nOuts; k++ )
                if ( ((Values[k] >> ((m >> k) & 1)) & 1) == 0 )
                    break;
            if ( k < nOuts )
                continue;
            if ( Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) )
                continue;
            if ( nErrors++ == 0 )
                printf( "For pattern %d, minterm %d produced by function is not in the relation.\n", i, m );
        }
    }
    if ( nErrors )    
        printf( "Total number of similar errors = %d.\n", nErrors );
    else
        printf( "The function agrees with the relation.\n" );
}